

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesNH42
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  long lVar1;
  uint8_t *puVar2;
  ushort uVar3;
  size_t sVar4;
  size_t sVar5;
  BrotliEncoderDictionary *pBVar6;
  void *pvVar7;
  void *pvVar8;
  HasherCommon *pHVar9;
  BrotliDictionary *pBVar10;
  undefined8 uVar11;
  bool bVar12;
  ulong uVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  uint uVar16;
  uint32_t uVar17;
  uint32_t *addr_1;
  uint8_t *puVar18;
  ulong uVar19;
  ulong *puVar20;
  long lVar21;
  uint8_t *puVar22;
  byte bVar23;
  uint uVar24;
  uint8_t *puVar25;
  uint8_t *puVar26;
  ulong *puVar27;
  ulong uVar28;
  uint8_t *puVar29;
  ulong uVar30;
  ulong uVar31;
  ulong *puVar32;
  int iVar33;
  uint8_t *puVar34;
  uint8_t *puVar35;
  size_t key;
  uint16_t uVar36;
  uint uVar37;
  uint8_t *puVar38;
  ulong *puVar39;
  uint8_t *puVar40;
  int iVar41;
  long lVar42;
  uint8_t *puVar43;
  ulong uVar44;
  ulong uVar45;
  size_t sVar46;
  ulong uVar47;
  ulong *puVar48;
  uint8_t *puVar49;
  size_t key_1;
  ulong uVar50;
  bool bVar51;
  int iVar52;
  uint8_t *local_160;
  int local_154;
  size_t local_150;
  uint8_t *local_140;
  uint8_t *local_130;
  ulong local_120;
  uint8_t *local_118;
  uint8_t *local_108;
  uint8_t *local_f0;
  ulong local_e8;
  Command *local_e0;
  uint local_cc;
  uint8_t *local_c8;
  ulong local_88;
  uint8_t *s1_orig_1;
  int last_distance;
  
  iVar33 = params->lgwin;
  sVar4 = params->stream_offset;
  local_150 = *last_insert_len;
  puVar18 = (uint8_t *)((position - 3) + num_bytes);
  if (num_bytes < 4) {
    puVar18 = (uint8_t *)position;
  }
  puVar2 = (uint8_t *)(position + num_bytes);
  lVar42 = 0x200;
  if (params->quality < 9) {
    lVar42 = 0x40;
  }
  sVar5 = (params->dictionary).compound.total_size;
  iVar41 = (int)*(undefined8 *)dist_cache;
  iVar52 = (int)((ulong)*(undefined8 *)dist_cache >> 0x20);
  dist_cache[4] = iVar41 + -1;
  dist_cache[5] = iVar41 + 1;
  dist_cache[6] = iVar41 + -2;
  dist_cache[7] = iVar41 + 2;
  dist_cache[8] = iVar41 + -3;
  dist_cache[9] = iVar41 + 3;
  dist_cache[10] = iVar52 + -1;
  dist_cache[0xb] = iVar52 + 1;
  dist_cache[0xc] = iVar52 + -2;
  dist_cache[0xd] = iVar52 + 2;
  dist_cache[0xe] = iVar52 + -3;
  dist_cache[0xf] = iVar52 + 3;
  if ((uint8_t *)(position + 4) < puVar2) {
    puVar34 = (uint8_t *)((1L << ((byte)iVar33 & 0x3f)) + -0x10);
    local_c8 = (uint8_t *)(lVar42 + position);
    lVar1 = sVar5 + 1;
    local_e0 = commands;
    puVar22 = (uint8_t *)position;
    do {
      puVar35 = puVar34;
      if (puVar22 < puVar34) {
        puVar35 = puVar22;
      }
      puVar25 = puVar22 + sVar4;
      if (puVar34 <= puVar22 + sVar4) {
        puVar25 = puVar34;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_cc = 0;
        local_88 = 0;
      }
      else {
        if (puVar22 == (uint8_t *)0x0) {
          local_88 = 0;
        }
        else {
          local_88 = (ulong)ringbuffer[(ulong)(puVar22 + 0xffffffffffffffff) & ringbuffer_mask];
        }
        if (puVar22 < (uint8_t *)0x2) {
          uVar50 = 0;
        }
        else {
          uVar50 = (ulong)ringbuffer[(ulong)(puVar22 + 0xfffffffffffffffe) & ringbuffer_mask];
        }
        local_cc = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[uVar50 + 0x100] | literal_context_lut[local_88]];
      }
      local_140 = puVar2 + -(long)puVar22;
      pBVar6 = (params->dictionary).contextual.dict[local_cc];
      puVar29 = (uint8_t *)(params->dist).max_distance;
      pvVar7 = (hasher->privat)._H42.extra[0];
      pvVar8 = (hasher->privat)._H42.extra[1];
      uVar19 = (ulong)puVar22 & ringbuffer_mask;
      puVar20 = (ulong *)(ringbuffer + uVar19);
      uVar24 = (uint)(*(int *)(ringbuffer + uVar19) * 0x1e35a7bd) >> 0x11;
      local_120 = 0x7e4;
      local_160 = (uint8_t *)0x0;
      lVar21 = 0;
      puVar49 = (uint8_t *)0x0;
      local_130 = (uint8_t *)0x0;
      uVar50 = 0x7e4;
      do {
        puVar38 = (uint8_t *)(long)dist_cache[lVar21];
        puVar26 = puVar22 + -(long)puVar38;
        if ((((lVar21 == 0) ||
             (*(char *)((long)pvVar7 + ((ulong)puVar26 & 0xffff) + 0x30000) == (char)uVar24)) &&
            (puVar38 <= puVar35)) && (puVar26 < puVar22)) {
          puVar27 = (ulong *)(ringbuffer + ((ulong)puVar26 & ringbuffer_mask));
          puVar43 = local_140;
          puVar39 = puVar20;
          puVar32 = puVar27;
          for (puVar26 = local_140; (uint8_t *)0x7 < puVar26; puVar26 = puVar26 + -8) {
            uVar45 = *puVar39;
            uVar28 = *puVar32;
            if (uVar45 == uVar28) {
              puVar32 = puVar32 + 1;
            }
            else {
              uVar30 = 0;
              if ((uVar28 ^ uVar45) != 0) {
                for (; ((uVar28 ^ uVar45) >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                }
              }
              puVar43 = (uint8_t *)((long)puVar32 + ((uVar30 >> 3 & 0x1fffffff) - (long)puVar27));
            }
            if (uVar45 != uVar28) goto LAB_00316b5c;
            puVar39 = puVar39 + 1;
          }
          puVar48 = puVar32;
          if (puVar26 != (uint8_t *)0x0) {
            puVar48 = (ulong *)((long)puVar32 + (long)puVar26);
            puVar43 = (uint8_t *)0x0;
            do {
              if (*(uint8_t *)((long)puVar32 + (long)puVar43) !=
                  *(uint8_t *)((long)puVar39 + (long)puVar43)) {
                puVar48 = (ulong *)((long)puVar32 + (long)puVar43);
                break;
              }
              puVar43 = puVar43 + 1;
            } while (puVar26 != puVar43);
          }
          puVar43 = (uint8_t *)((long)puVar48 - (long)puVar27);
LAB_00316b5c:
          if (((uint8_t *)0x1 < puVar43) &&
             (uVar45 = (long)puVar43 * 0x87 + 0x78f, local_120 < uVar45)) {
            if (lVar21 != 0) {
              uVar45 = uVar45 - ((0x1ca10U >> ((byte)lVar21 & 0xe) & 0xe) + 0x27);
            }
            if (local_120 < uVar45) {
              puVar49 = puVar43;
              uVar50 = uVar45;
              local_160 = puVar43;
              local_130 = puVar38;
              local_120 = uVar45;
            }
          }
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 0x10);
      uVar30 = (ulong)uVar24;
      uVar37 = uVar24 & 0x1ff;
      sVar46 = (hasher->privat)._H42.max_hops;
      uVar44 = (long)puVar22 - (ulong)*(uint *)((long)pvVar7 + uVar30 * 4);
      uVar28 = (ulong)*(ushort *)((long)pvVar7 + uVar30 * 2 + 0x20000);
      puVar26 = (uint8_t *)0x0;
      uVar45 = uVar44;
      do {
        bVar51 = sVar46 == 0;
        sVar46 = sVar46 - 1;
        local_108 = puVar49;
        local_e8 = uVar50;
        if (bVar51) break;
        puVar26 = puVar26 + uVar45;
        puVar38 = local_160;
        puVar43 = local_130;
        uVar47 = local_120;
        if (puVar26 <= puVar35) {
          uVar31 = (ulong)*(ushort *)((long)pvVar8 + uVar28 * 4 + (ulong)(uVar37 << 0xb) + 2);
          uVar45 = (ulong)*(ushort *)((long)pvVar8 + uVar28 * 4 + (ulong)(uVar37 << 0xb));
          uVar28 = uVar31;
          if (local_160 + uVar19 <= ringbuffer_mask) {
            uVar31 = (long)puVar22 - (long)puVar26 & ringbuffer_mask;
            if ((local_160 + uVar31 <= ringbuffer_mask) &&
               (ringbuffer[(long)(local_160 + uVar19)] == ringbuffer[(long)(local_160 + uVar31)])) {
              puVar27 = (ulong *)(ringbuffer + uVar31);
              local_108 = local_140;
              puVar39 = puVar20;
              puVar32 = puVar27;
              for (puVar38 = local_140; (uint8_t *)0x7 < puVar38; puVar38 = puVar38 + -8) {
                uVar47 = *puVar39;
                uVar31 = *puVar32;
                if (uVar47 == uVar31) {
                  puVar32 = puVar32 + 1;
                }
                else {
                  uVar13 = 0;
                  if ((uVar31 ^ uVar47) != 0) {
                    for (; ((uVar31 ^ uVar47) >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                    }
                  }
                  local_108 = (uint8_t *)
                              ((long)puVar32 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar27));
                }
                if (uVar47 != uVar31) goto LAB_00316d55;
                puVar39 = puVar39 + 1;
              }
              puVar48 = puVar32;
              if (puVar38 != (uint8_t *)0x0) {
                puVar48 = (ulong *)((long)puVar32 + (long)puVar38);
                puVar43 = (uint8_t *)0x0;
                do {
                  if (*(uint8_t *)((long)puVar32 + (long)puVar43) !=
                      *(uint8_t *)((long)puVar39 + (long)puVar43)) {
                    puVar48 = (ulong *)((long)puVar32 + (long)puVar43);
                    break;
                  }
                  puVar43 = puVar43 + 1;
                } while (puVar38 != puVar43);
              }
              local_108 = (uint8_t *)((long)puVar48 - (long)puVar27);
LAB_00316d55:
              if ((uint8_t *)0x3 < local_108) {
                iVar33 = 0x1f;
                if ((uint)puVar26 != 0) {
                  for (; (uint)puVar26 >> iVar33 == 0; iVar33 = iVar33 + -1) {
                  }
                }
                local_e8 = (ulong)(iVar33 * -0x1e + 0x780) + (long)local_108 * 0x87;
                puVar38 = local_108;
                puVar43 = puVar26;
                uVar47 = local_e8;
                if (local_120 < local_e8) goto LAB_00316d33;
              }
              local_108 = puVar49;
              local_e8 = uVar50;
              puVar38 = local_160;
              puVar43 = local_130;
              uVar47 = local_120;
            }
          }
        }
LAB_00316d33:
        local_120 = uVar47;
        local_130 = puVar43;
        local_160 = puVar38;
        puVar49 = local_108;
        uVar50 = local_e8;
      } while (puVar26 <= puVar35);
      uVar3 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar37 * 2);
      *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar37 * 2) = uVar3 + 1;
      uVar16 = uVar3 & 0x1ff;
      *(char *)((long)pvVar7 + ((ulong)puVar22 & 0xffff) + 0x30000) = (char)uVar24;
      if (0xfffe < uVar44) {
        uVar44 = 0xffff;
      }
      *(short *)((long)pvVar8 + (ulong)uVar16 * 4 + (ulong)(uVar37 << 0xb)) = (short)uVar44;
      *(undefined2 *)((long)pvVar8 + (ulong)uVar16 * 4 + (ulong)(uVar37 << 0xb) + 2) =
           *(undefined2 *)((long)pvVar7 + uVar30 * 2 + 0x20000);
      *(int *)((long)pvVar7 + uVar30 * 4) = (int)puVar22;
      *(short *)((long)pvVar7 + uVar30 * 2 + 0x20000) = (short)uVar16;
      if (local_e8 == 0x7e4) {
        pHVar9 = (hasher->privat)._H42.common;
        if (pHVar9->dict_num_matches < pHVar9->dict_num_lookups >> 7) {
          local_154 = 0;
        }
        else {
          uVar50 = (ulong)((uint)((int)*puVar20 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
          puVar35 = pBVar6->hash_table_lengths;
          sVar46 = pHVar9->dict_num_lookups;
          local_154 = 0;
          lVar21 = 0;
          do {
            sVar46 = sVar46 + 1;
            pHVar9->dict_num_lookups = sVar46;
            bVar23 = puVar35[uVar50];
            puVar49 = (uint8_t *)(ulong)bVar23;
            if (puVar49 != (uint8_t *)0x0) {
              bVar51 = true;
              if (puVar49 <= local_140) {
                pBVar10 = pBVar6->words;
                puVar32 = (ulong *)(pBVar10->data +
                                   (ulong)pBVar10->offsets_by_length[(long)puVar49] +
                                   (ulong)pBVar6->hash_table_words[uVar50] * (long)puVar49);
                puVar26 = puVar49;
                puVar39 = puVar20;
                puVar38 = ringbuffer;
                if (7 < bVar23) {
                  do {
                    uVar19 = *puVar32;
                    uVar45 = *puVar39;
                    if (uVar19 == uVar45) {
                      puVar39 = puVar39 + 1;
                    }
                    else {
                      uVar28 = 0;
                      if ((uVar45 ^ uVar19) != 0) {
                        for (; ((uVar45 ^ uVar19) >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                        }
                      }
                      puVar38 = (uint8_t *)
                                ((long)puVar39 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar20));
                    }
                    if (uVar19 != uVar45) goto LAB_0031787f;
                    puVar32 = puVar32 + 1;
                    puVar26 = puVar26 + -8;
                  } while ((uint8_t *)0x7 < puVar26);
                }
                puVar27 = puVar39;
                if (puVar26 != (uint8_t *)0x0) {
                  puVar27 = (ulong *)((long)puVar39 + (long)puVar26);
                  puVar38 = (uint8_t *)0x0;
                  do {
                    if (*(uint8_t *)((long)puVar39 + (long)puVar38) !=
                        *(uint8_t *)((long)puVar32 + (long)puVar38)) {
                      puVar27 = (ulong *)((long)puVar39 + (long)puVar38);
                      break;
                    }
                    puVar38 = puVar38 + 1;
                  } while (puVar26 != puVar38);
                }
                puVar38 = (uint8_t *)((long)puVar27 - (long)puVar20);
LAB_0031787f:
                if (((puVar38 != (uint8_t *)0x0) &&
                    (puVar49 < puVar38 + pBVar6->cutoffTransformsCount)) &&
                   (puVar49 = puVar25 + ((ulong)((uint)(pBVar6->cutoffTransforms >>
                                                       ((char)((long)puVar49 - (long)puVar38) *
                                                        '\x06' & 0x3fU)) & 0x3f) +
                                         ((long)puVar49 - (long)puVar38) * 4 <<
                                        (puVar49[(long)pBVar10] & 0x3f)) +
                                        (ulong)pBVar6->hash_table_words[uVar50] + lVar1,
                   puVar49 <= puVar29)) {
                  iVar33 = 0x1f;
                  if ((uint)puVar49 != 0) {
                    for (; (uint)puVar49 >> iVar33 == 0; iVar33 = iVar33 + -1) {
                    }
                  }
                  uVar19 = ((long)puVar38 * 0x87 - (ulong)(uint)(iVar33 * 0x1e)) + 0x780;
                  if (local_e8 <= uVar19) {
                    local_154 = (uint)bVar23 - (int)puVar38;
                    bVar51 = false;
                    local_130 = puVar49;
                    local_108 = puVar38;
                    local_e8 = uVar19;
                  }
                }
              }
              if (!bVar51) {
                pHVar9->dict_num_matches = pHVar9->dict_num_matches + 1;
              }
            }
            uVar50 = uVar50 + 1;
            bVar51 = lVar21 == 0;
            lVar21 = lVar21 + 1;
          } while (bVar51);
        }
      }
      else {
        local_154 = 0;
      }
      if (local_e8 < 0x7e5) {
        local_150 = local_150 + 1;
        position = (size_t)(puVar22 + 1);
        if (local_c8 < position) {
          if (local_c8 + (uint)((int)lVar42 * 4) < position) {
            puVar35 = puVar22 + 0x11;
            if (puVar2 + 0xfffffffffffffffc <= puVar22 + 0x11) {
              puVar35 = puVar2 + 0xfffffffffffffffc;
            }
            if (position < puVar35) {
              pvVar7 = (hasher->privat)._H42.extra[0];
              pvVar8 = (hasher->privat)._H42.extra[1];
              do {
                uVar24 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                         0x11;
                uVar50 = (ulong)uVar24;
                uVar16 = uVar24 & 0x1ff;
                uVar3 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar16 * 2);
                *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar16 * 2) = uVar3 + 1;
                uVar37 = uVar3 & 0x1ff;
                uVar19 = position - *(uint *)((long)pvVar7 + uVar50 * 4);
                if (0xfffe < uVar19) {
                  uVar19 = 0xffff;
                }
                *(char *)((long)pvVar7 + (position & 0xffff) + 0x30000) = (char)uVar24;
                *(short *)((long)pvVar8 + (ulong)uVar37 * 4 + (ulong)(uVar16 << 0xb)) =
                     (short)uVar19;
                *(undefined2 *)((long)pvVar8 + (ulong)uVar37 * 4 + (ulong)(uVar16 << 0xb) + 2) =
                     *(undefined2 *)((long)pvVar7 + uVar50 * 2 + 0x20000);
                *(int *)((long)pvVar7 + uVar50 * 4) = (int)position;
                *(short *)((long)pvVar7 + uVar50 * 2 + 0x20000) = (short)uVar37;
                local_150 = local_150 + 4;
                position = position + 4;
              } while (position < puVar35);
            }
          }
          else {
            puVar35 = puVar22 + 9;
            if (puVar2 + 0xfffffffffffffffd <= puVar22 + 9) {
              puVar35 = puVar2 + 0xfffffffffffffffd;
            }
            if (position < puVar35) {
              pvVar7 = (hasher->privat)._H42.extra[0];
              pvVar8 = (hasher->privat)._H42.extra[1];
              do {
                uVar24 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                         0x11;
                uVar50 = (ulong)uVar24;
                uVar16 = uVar24 & 0x1ff;
                uVar3 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar16 * 2);
                *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar16 * 2) = uVar3 + 1;
                uVar37 = uVar3 & 0x1ff;
                uVar19 = position - *(uint *)((long)pvVar7 + uVar50 * 4);
                if (0xfffe < uVar19) {
                  uVar19 = 0xffff;
                }
                *(char *)((long)pvVar7 + (position & 0xffff) + 0x30000) = (char)uVar24;
                *(short *)((long)pvVar8 + (ulong)uVar37 * 4 + (ulong)(uVar16 << 0xb)) =
                     (short)uVar19;
                *(undefined2 *)((long)pvVar8 + (ulong)uVar37 * 4 + (ulong)(uVar16 << 0xb) + 2) =
                     *(undefined2 *)((long)pvVar7 + uVar50 * 2 + 0x20000);
                *(int *)((long)pvVar7 + uVar50 * 4) = (int)position;
                *(short *)((long)pvVar7 + uVar50 * 2 + 0x20000) = (short)uVar37;
                local_150 = local_150 + 2;
                position = position + 2;
              } while (position < puVar35);
            }
          }
        }
      }
      else {
        iVar33 = 0;
        do {
          local_140 = local_140 + -1;
          local_118 = local_108 + -1;
          if (local_140 <= local_108 + -1) {
            local_118 = local_140;
          }
          if (4 < params->quality) {
            local_118 = (uint8_t *)0x0;
          }
          puVar35 = puVar22 + 1;
          puVar25 = puVar34;
          if (puVar35 < puVar34) {
            puVar25 = puVar35;
          }
          puVar29 = puVar22 + sVar4 + 1;
          if (puVar34 <= puVar22 + sVar4 + 1) {
            puVar29 = puVar34;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            local_cc = (uint)(params->dictionary).contextual.context_map
                             [literal_context_lut[local_88 + 0x100] |
                              literal_context_lut[ringbuffer[(ulong)puVar22 & ringbuffer_mask]]];
            local_88 = (ulong)ringbuffer[(ulong)puVar22 & ringbuffer_mask];
          }
          pBVar6 = (params->dictionary).contextual.dict[local_cc];
          puVar49 = (uint8_t *)(params->dist).max_distance;
          pvVar7 = (hasher->privat)._H42.extra[0];
          pvVar8 = (hasher->privat)._H42.extra[1];
          uVar19 = (ulong)puVar35 & ringbuffer_mask;
          puVar20 = (ulong *)(ringbuffer + uVar19);
          uVar24 = (uint)(*(int *)(ringbuffer + uVar19) * 0x1e35a7bd) >> 0x11;
          local_160 = (uint8_t *)0x7e4;
          lVar21 = 0;
          puVar26 = (uint8_t *)0x0;
          local_f0 = (uint8_t *)0x0;
          uVar50 = 0x7e4;
          do {
            puVar43 = (uint8_t *)(long)dist_cache[lVar21];
            puVar38 = puVar35 + -(long)puVar43;
            if (((lVar21 == 0) ||
                (*(char *)((long)pvVar7 + ((ulong)puVar38 & 0xffff) + 0x30000) == (char)uVar24)) &&
               ((puVar43 <= puVar25 && (puVar38 < puVar35)))) {
              puVar27 = (ulong *)(ringbuffer + ((ulong)puVar38 & ringbuffer_mask));
              puVar40 = local_140;
              puVar39 = puVar20;
              puVar32 = puVar27;
              for (puVar38 = local_140; (uint8_t *)0x7 < puVar38; puVar38 = puVar38 + -8) {
                uVar45 = *puVar39;
                uVar28 = *puVar32;
                if (uVar45 == uVar28) {
                  puVar32 = puVar32 + 1;
                }
                else {
                  uVar30 = 0;
                  if ((uVar28 ^ uVar45) != 0) {
                    for (; ((uVar28 ^ uVar45) >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                    }
                  }
                  puVar40 = (uint8_t *)
                            ((long)puVar32 + ((uVar30 >> 3 & 0x1fffffff) - (long)puVar27));
                }
                if (uVar45 != uVar28) goto LAB_0031708b;
                puVar39 = puVar39 + 1;
              }
              puVar48 = puVar32;
              if (puVar38 != (uint8_t *)0x0) {
                puVar48 = (ulong *)((long)puVar32 + (long)puVar38);
                puVar40 = (uint8_t *)0x0;
                do {
                  if (*(uint8_t *)((long)puVar32 + (long)puVar40) !=
                      *(uint8_t *)((long)puVar39 + (long)puVar40)) {
                    puVar48 = (ulong *)((long)puVar32 + (long)puVar40);
                    break;
                  }
                  puVar40 = puVar40 + 1;
                } while (puVar38 != puVar40);
              }
              puVar40 = (uint8_t *)((long)puVar48 - (long)puVar27);
LAB_0031708b:
              if (((uint8_t *)0x1 < puVar40) &&
                 (uVar45 = (long)puVar40 * 0x87 + 0x78f, local_160 < uVar45)) {
                if (lVar21 != 0) {
                  uVar45 = uVar45 - ((0x1ca10U >> ((byte)lVar21 & 0xe) & 0xe) + 0x27);
                }
                if (local_160 < uVar45) {
                  uVar50 = uVar45;
                  puVar26 = puVar40;
                  local_160 = (uint8_t *)uVar45;
                  local_118 = puVar40;
                  local_f0 = puVar43;
                }
              }
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 != 0x10);
          uVar44 = (ulong)uVar24;
          uVar37 = uVar24 & 0x1ff;
          sVar46 = (hasher->privat)._H42.max_hops;
          uVar30 = (long)puVar35 - (ulong)*(uint *)((long)pvVar7 + uVar44 * 4);
          uVar28 = (ulong)*(ushort *)((long)pvVar7 + uVar44 * 2 + 0x20000);
          puVar38 = (uint8_t *)0x0;
          uVar45 = uVar30;
          do {
            bVar51 = sVar46 == 0;
            sVar46 = sVar46 - 1;
            puVar43 = puVar26;
            if (bVar51) break;
            puVar38 = puVar38 + uVar45;
            uVar47 = uVar50;
            puVar40 = local_118;
            puVar14 = local_160;
            puVar15 = local_f0;
            if (puVar38 <= puVar25) {
              uVar31 = (ulong)*(ushort *)((long)pvVar8 + uVar28 * 4 + (ulong)(uVar37 << 0xb) + 2);
              uVar45 = (ulong)*(ushort *)((long)pvVar8 + uVar28 * 4 + (ulong)(uVar37 << 0xb));
              uVar28 = uVar31;
              if (local_118 + uVar19 <= ringbuffer_mask) {
                uVar31 = (long)puVar35 - (long)puVar38 & ringbuffer_mask;
                if ((ringbuffer_mask < local_118 + uVar31) ||
                   (ringbuffer[(long)(local_118 + uVar19)] != ringbuffer[(long)(local_118 + uVar31)]
                   )) goto LAB_00317258;
                puVar27 = (ulong *)(ringbuffer + uVar31);
                puVar43 = local_140;
                puVar39 = puVar20;
                puVar32 = puVar27;
                for (puVar40 = local_140; (uint8_t *)0x7 < puVar40; puVar40 = puVar40 + -8) {
                  uVar47 = *puVar39;
                  uVar31 = *puVar32;
                  if (uVar47 == uVar31) {
                    puVar32 = puVar32 + 1;
                  }
                  else {
                    uVar13 = 0;
                    if ((uVar31 ^ uVar47) != 0) {
                      for (; ((uVar31 ^ uVar47) >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                      }
                    }
                    puVar43 = (uint8_t *)
                              ((long)puVar32 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar27));
                  }
                  if (uVar47 != uVar31) goto LAB_00317297;
                  puVar39 = puVar39 + 1;
                }
                puVar48 = puVar32;
                if (puVar40 != (uint8_t *)0x0) {
                  puVar48 = (ulong *)((long)puVar32 + (long)puVar40);
                  puVar43 = (uint8_t *)0x0;
                  do {
                    if (*(uint8_t *)((long)puVar32 + (long)puVar43) !=
                        *(uint8_t *)((long)puVar39 + (long)puVar43)) {
                      puVar48 = (ulong *)((long)puVar32 + (long)puVar43);
                      break;
                    }
                    puVar43 = puVar43 + 1;
                  } while (puVar40 != puVar43);
                }
                puVar43 = (uint8_t *)((long)puVar48 - (long)puVar27);
LAB_00317297:
                if ((uint8_t *)0x3 < puVar43) {
                  iVar41 = 0x1f;
                  if ((uint)puVar38 != 0) {
                    for (; (uint)puVar38 >> iVar41 == 0; iVar41 = iVar41 + -1) {
                    }
                  }
                  uVar47 = (ulong)(iVar41 * -0x1e + 0x780) + (long)puVar43 * 0x87;
                  puVar40 = puVar43;
                  puVar14 = (uint8_t *)uVar47;
                  puVar15 = puVar38;
                  if (local_160 < uVar47) goto LAB_00317258;
                }
              }
              puVar43 = puVar26;
              uVar47 = uVar50;
              puVar40 = local_118;
              puVar14 = local_160;
              puVar15 = local_f0;
            }
LAB_00317258:
            local_f0 = puVar15;
            local_160 = puVar14;
            uVar50 = uVar47;
            puVar26 = puVar43;
            local_118 = puVar40;
          } while (puVar38 <= puVar25);
          uVar3 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar37 * 2);
          *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar37 * 2) = uVar3 + 1;
          uVar16 = uVar3 & 0x1ff;
          *(char *)((long)pvVar7 + ((ulong)puVar35 & 0xffff) + 0x30000) = (char)uVar24;
          if (0xfffe < uVar30) {
            uVar30 = 0xffff;
          }
          *(short *)((long)pvVar8 + (ulong)uVar16 * 4 + (ulong)(uVar37 << 0xb)) = (short)uVar30;
          *(undefined2 *)((long)pvVar8 + (ulong)uVar16 * 4 + (ulong)(uVar37 << 0xb) + 2) =
               *(undefined2 *)((long)pvVar7 + uVar44 * 2 + 0x20000);
          *(int *)((long)pvVar7 + uVar44 * 4) = (int)puVar35;
          *(short *)((long)pvVar7 + uVar44 * 2 + 0x20000) = (short)uVar16;
          if (uVar50 == 0x7e4) {
            pHVar9 = (hasher->privat)._H42.common;
            if (pHVar9->dict_num_matches < pHVar9->dict_num_lookups >> 7) {
              iVar41 = 0;
            }
            else {
              uVar19 = (ulong)((uint)((int)*puVar20 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
              puVar25 = pBVar6->hash_table_lengths;
              sVar46 = pHVar9->dict_num_lookups;
              iVar41 = 0;
              lVar21 = 0;
              do {
                sVar46 = sVar46 + 1;
                pHVar9->dict_num_lookups = sVar46;
                bVar23 = puVar25[uVar19];
                puVar26 = (uint8_t *)(ulong)bVar23;
                if (puVar26 != (uint8_t *)0x0) {
                  bVar51 = true;
                  if (puVar26 <= local_140) {
                    pBVar10 = pBVar6->words;
                    puVar32 = (ulong *)(pBVar10->data +
                                       (ulong)pBVar10->offsets_by_length[(long)puVar26] +
                                       (ulong)pBVar6->hash_table_words[uVar19] * (long)puVar26);
                    puVar39 = puVar20;
                    puVar38 = (uint8_t *)ringbuffer_mask;
                    puVar40 = puVar26;
                    if (7 < bVar23) {
                      do {
                        uVar45 = *puVar32;
                        uVar28 = *puVar39;
                        if (uVar45 == uVar28) {
                          puVar39 = puVar39 + 1;
                        }
                        else {
                          uVar30 = 0;
                          if ((uVar28 ^ uVar45) != 0) {
                            for (; ((uVar28 ^ uVar45) >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                            }
                          }
                          puVar38 = (uint8_t *)
                                    ((long)puVar39 + ((uVar30 >> 3 & 0x1fffffff) - (long)puVar20));
                        }
                        if (uVar45 != uVar28) goto LAB_003174fa;
                        puVar32 = puVar32 + 1;
                        puVar40 = puVar40 + -8;
                      } while ((uint8_t *)0x7 < puVar40);
                    }
                    puVar27 = puVar39;
                    if (puVar40 != (uint8_t *)0x0) {
                      puVar27 = (ulong *)((long)puVar39 + (long)puVar40);
                      puVar38 = (uint8_t *)0x0;
                      do {
                        if (*(uint8_t *)((long)puVar39 + (long)puVar38) !=
                            *(uint8_t *)((long)puVar32 + (long)puVar38)) {
                          puVar27 = (ulong *)((long)puVar39 + (long)puVar38);
                          break;
                        }
                        puVar38 = puVar38 + 1;
                      } while (puVar40 != puVar38);
                    }
                    puVar38 = (uint8_t *)((long)puVar27 - (long)puVar20);
LAB_003174fa:
                    if (((puVar38 == (uint8_t *)0x0) ||
                        (puVar38 + pBVar6->cutoffTransformsCount <= puVar26)) ||
                       (puVar26 = puVar29 + ((ulong)((uint)(pBVar6->cutoffTransforms >>
                                                           ((char)((long)puVar26 - (long)puVar38) *
                                                            '\x06' & 0x3fU)) & 0x3f) +
                                             ((long)puVar26 - (long)puVar38) * 4 <<
                                            (puVar26[(long)pBVar10] & 0x3f)) +
                                            (ulong)pBVar6->hash_table_words[uVar19] + lVar1,
                       puVar49 < puVar26)) {
                      bVar51 = true;
                    }
                    else {
                      iVar52 = 0x1f;
                      if ((uint)puVar26 != 0) {
                        for (; (uint)puVar26 >> iVar52 == 0; iVar52 = iVar52 + -1) {
                        }
                      }
                      uVar45 = ((long)puVar38 * 0x87 - (ulong)(uint)(iVar52 * 0x1e)) + 0x780;
                      bVar51 = true;
                      if (uVar50 <= uVar45) {
                        iVar41 = (uint)bVar23 - (int)puVar38;
                        bVar51 = false;
                        puVar43 = puVar38;
                        uVar50 = uVar45;
                        local_f0 = puVar26;
                      }
                    }
                  }
                  if (!bVar51) {
                    pHVar9->dict_num_matches = pHVar9->dict_num_matches + 1;
                  }
                }
                uVar19 = uVar19 + 1;
                bVar51 = lVar21 == 0;
                lVar21 = lVar21 + 1;
              } while (bVar51);
            }
          }
          else {
            iVar41 = 0;
          }
          bVar51 = local_e8 + 0xaf <= uVar50;
          local_c8 = puVar22;
          iVar52 = iVar33;
          if (bVar51) {
            local_150 = local_150 + 1;
            local_130 = local_f0;
            local_c8 = puVar35;
            local_154 = iVar41;
            local_108 = puVar43;
            local_e8 = uVar50;
            iVar52 = iVar33 + 1;
          }
          bVar12 = iVar33 < 3;
          puVar35 = puVar22 + 5;
          puVar22 = local_c8;
          iVar33 = iVar52;
        } while (bVar51 && (bVar12 && puVar35 < puVar2));
        puVar22 = local_c8 + sVar4;
        if (puVar34 <= local_c8 + sVar4) {
          puVar22 = puVar34;
        }
        if (puVar22 + sVar5 < local_130) {
LAB_00317a72:
          puVar35 = local_130 + 0xf;
        }
        else {
          uVar24 = 0;
          bVar51 = false;
          if (local_130 != (uint8_t *)(long)*dist_cache) {
            if (local_130 == (uint8_t *)(long)dist_cache[1]) {
              uVar24 = 1;
            }
            else {
              if (local_130 + (3 - (long)*dist_cache) < (uint8_t *)0x7) {
                bVar23 = (byte)((int)(local_130 + (3 - (long)*dist_cache)) << 2);
                uVar24 = 0x9750468;
              }
              else {
                if ((uint8_t *)0x6 < local_130 + (3 - (long)dist_cache[1])) {
                  if (local_130 != (uint8_t *)(long)dist_cache[2]) {
                    bVar51 = local_130 != (uint8_t *)(long)dist_cache[3];
                    uVar24 = 3;
                    goto LAB_00317a69;
                  }
                  uVar24 = 2;
                  goto LAB_00317a67;
                }
                bVar23 = (byte)((int)(local_130 + (3 - (long)dist_cache[1])) << 2);
                uVar24 = 0xfdb1ace;
              }
              uVar24 = uVar24 >> (bVar23 & 0x1f) & 0xf;
            }
LAB_00317a67:
            bVar51 = false;
          }
LAB_00317a69:
          if (bVar51) goto LAB_00317a72;
          puVar35 = (uint8_t *)(ulong)uVar24;
        }
        if ((local_130 <= puVar22 + sVar5) && (puVar35 != (uint8_t *)0x0)) {
          dist_cache[3] = dist_cache[2];
          uVar11 = *(undefined8 *)dist_cache;
          *(undefined8 *)(dist_cache + 1) = uVar11;
          iVar33 = (int)local_130;
          *dist_cache = iVar33;
          dist_cache[4] = iVar33 + -1;
          dist_cache[5] = iVar33 + 1;
          dist_cache[6] = iVar33 + -2;
          dist_cache[7] = iVar33 + 2;
          dist_cache[8] = iVar33 + -3;
          dist_cache[9] = iVar33 + 3;
          iVar33 = (int)uVar11;
          dist_cache[10] = iVar33 + -1;
          dist_cache[0xb] = iVar33 + 1;
          dist_cache[0xc] = iVar33 + -2;
          dist_cache[0xd] = iVar33 + 2;
          *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar33 + 3,iVar33 + -3);
        }
        uVar24 = (uint)local_150;
        local_e0->insert_len_ = uVar24;
        local_e0->copy_len_ = local_154 << 0x19 | (uint)local_108;
        uVar50 = (ulong)(params->dist).num_direct_distance_codes;
        puVar22 = (uint8_t *)(uVar50 + 0x10);
        if (puVar35 < puVar22) {
          local_e0->dist_prefix_ = (uint16_t)puVar35;
          uVar17 = 0;
        }
        else {
          uVar17 = (params->dist).distance_postfix_bits;
          bVar23 = (byte)uVar17;
          puVar35 = puVar35 + ((4L << (bVar23 & 0x3f)) - uVar50) + -0x10;
          uVar37 = 0x1f;
          if ((uint)puVar35 != 0) {
            for (; (uint)puVar35 >> uVar37 == 0; uVar37 = uVar37 - 1) {
            }
          }
          uVar37 = (uVar37 ^ 0xffffffe0) + 0x1f;
          bVar51 = ((ulong)puVar35 >> ((ulong)uVar37 & 0x3f) & 1) != 0;
          iVar33 = uVar37 - uVar17;
          local_e0->dist_prefix_ =
               (short)((uint)bVar51 + iVar33 * 2 + 0xfffe << (bVar23 & 0x3f)) +
               (short)puVar22 + (~(ushort)(-1 << (bVar23 & 0x1f)) & (ushort)puVar35) |
               (short)iVar33 * 0x400;
          uVar17 = (uint32_t)
                   ((long)puVar35 - ((ulong)bVar51 + 2 << ((byte)uVar37 & 0x3f)) >> (bVar23 & 0x3f))
          ;
        }
        local_e0->dist_extra_ = uVar17;
        if (5 < local_150) {
          if (local_150 < 0x82) {
            uVar24 = 0x1f;
            uVar37 = (uint)(local_150 - 2);
            if (uVar37 != 0) {
              for (; uVar37 >> uVar24 == 0; uVar24 = uVar24 - 1) {
              }
            }
            uVar24 = (int)(local_150 - 2 >> ((char)(uVar24 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar24 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_150 < 0x842) {
            uVar37 = 0x1f;
            if (uVar24 - 0x42 != 0) {
              for (; uVar24 - 0x42 >> uVar37 == 0; uVar37 = uVar37 - 1) {
              }
            }
            uVar24 = (uVar37 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar24 = 0x15;
            if (0x1841 < local_150) {
              uVar24 = (uint)(ushort)(0x17 - (local_150 < 0x5842));
            }
          }
        }
        uVar37 = local_154 + (uint)local_108;
        if (uVar37 < 10) {
          uVar16 = uVar37 - 2;
        }
        else if (uVar37 < 0x86) {
          uVar37 = uVar37 - 6;
          uVar16 = 0x1f;
          if (uVar37 != 0) {
            for (; uVar37 >> uVar16 == 0; uVar16 = uVar16 - 1) {
            }
          }
          uVar16 = (int)((ulong)(long)(int)uVar37 >> ((char)(uVar16 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar16 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar16 = 0x17;
          if (uVar37 < 0x846) {
            uVar16 = 0x1f;
            if (uVar37 - 0x46 != 0) {
              for (; uVar37 - 0x46 >> uVar16 == 0; uVar16 = uVar16 - 1) {
              }
            }
            uVar16 = (uVar16 ^ 0xffe0) + 0x2c;
          }
        }
        uVar3 = (ushort)uVar16;
        uVar36 = (uVar3 & 7) + ((ushort)uVar24 & 7) * 8;
        if ((((local_e0->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar24 < 8)) && (uVar3 < 0x10)) {
          if (7 < uVar3) {
            uVar36 = uVar36 + 0x40;
          }
        }
        else {
          iVar33 = ((uVar24 & 0xffff) >> 3) * 3 + ((uVar16 & 0xffff) >> 3);
          uVar36 = uVar36 + ((ushort)(0x520d40 >> ((char)iVar33 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar33 * 0x40 + 0x40;
        }
        local_e0->cmd_prefix_ = uVar36;
        *num_literals = *num_literals + local_150;
        position = (size_t)(local_c8 + (long)local_108);
        puVar22 = puVar18;
        if (position < puVar18) {
          puVar22 = (uint8_t *)position;
        }
        puVar35 = local_c8 + 2;
        if (local_130 < (uint8_t *)((ulong)local_108 >> 2)) {
          puVar25 = (uint8_t *)(position + (long)local_130 * -4);
          if ((uint8_t *)(position + (long)local_130 * -4) < puVar35) {
            puVar25 = puVar35;
          }
          puVar35 = puVar25;
          if (puVar22 < puVar25) {
            puVar35 = puVar22;
          }
        }
        local_c8 = local_c8 + lVar42 + (long)local_108 * 2;
        local_e0 = local_e0 + 1;
        if (puVar35 < puVar22) {
          pvVar7 = (hasher->privat)._H42.extra[0];
          pvVar8 = (hasher->privat)._H42.extra[1];
          do {
            uVar24 = (uint)(*(int *)(ringbuffer + ((ulong)puVar35 & ringbuffer_mask)) * 0x1e35a7bd)
                     >> 0x11;
            uVar19 = (ulong)uVar24;
            uVar16 = uVar24 & 0x1ff;
            uVar3 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar16 * 2);
            *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar16 * 2) = uVar3 + 1;
            uVar37 = uVar3 & 0x1ff;
            uVar50 = (long)puVar35 - (ulong)*(uint *)((long)pvVar7 + uVar19 * 4);
            *(char *)((long)pvVar7 + ((ulong)puVar35 & 0xffff) + 0x30000) = (char)uVar24;
            if (0xfffe < uVar50) {
              uVar50 = 0xffff;
            }
            *(short *)((long)pvVar8 + (ulong)uVar37 * 4 + (ulong)(uVar16 << 0xb)) = (short)uVar50;
            *(undefined2 *)((long)pvVar8 + (ulong)uVar37 * 4 + (ulong)(uVar16 << 0xb) + 2) =
                 *(undefined2 *)((long)pvVar7 + uVar19 * 2 + 0x20000);
            *(int *)((long)pvVar7 + uVar19 * 4) = (int)puVar35;
            *(short *)((long)pvVar7 + uVar19 * 2 + 0x20000) = (short)uVar37;
            puVar35 = puVar35 + 1;
          } while (puVar22 != puVar35);
          local_150 = 0;
        }
        else {
          local_150 = 0;
        }
      }
      puVar22 = (uint8_t *)position;
    } while ((uint8_t *)(position + 4) < puVar2);
  }
  else {
    local_e0 = commands;
  }
  *last_insert_len = (size_t)(puVar2 + (local_150 - position));
  *num_commands = *num_commands + ((long)local_e0 - (long)commands >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}